

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBUAcontig16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  uVar2 = img->samplesperpixel;
  while (bVar7 = h != 0, h = h - 1, bVar7) {
    lVar6 = (long)toskew * -4;
    for (lVar5 = 0; w != (uint32_t)lVar5; lVar5 = lVar5 + 1) {
      puVar3 = img->Bitdepth16To8;
      bVar1 = puVar3[*(ushort *)((long)pp + 6)];
      puVar4 = img->UaToAa;
      cp[lVar5] = (uint)bVar1 << 0x18 |
                  (uint)puVar4[(ulong)puVar3[*(ushort *)pp] + (ulong)bVar1 * 0x100] |
                  (uint)puVar4[(ulong)puVar3[*(ushort *)((long)pp + 2)] + (ulong)bVar1 * 0x100] << 8
                  | (uint)puVar4[(ulong)puVar3[*(ushort *)((long)pp + 4)] + (ulong)bVar1 * 0x100] <<
                    0x10;
      pp = (uchar *)((long)pp + (ulong)((uint)uVar2 + (uint)uVar2));
      lVar6 = lVar6 + -4;
    }
    cp = (uint32_t *)((long)cp - lVar6);
    pp = (uchar *)((long)pp + (long)(int)(fromskew * (uint)uVar2) * 2);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBUAcontig16bittile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t *wp = (uint16_t *)pp;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        uint32_t r, g, b, a;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            a = img->Bitdepth16To8[wp[3]];
            m = img->UaToAa + ((size_t)a << 8);
            r = m[img->Bitdepth16To8[wp[0]]];
            g = m[img->Bitdepth16To8[wp[1]]];
            b = m[img->Bitdepth16To8[wp[2]]];
            *cp++ = PACK4(r, g, b, a);
            wp += samplesperpixel;
        }
        cp += toskew;
        wp += fromskew;
    }
}